

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O3

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
::matches(Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
          *this,candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                candidate)

{
  BinaryOp BVar1;
  UnaryOp UVar2;
  matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_> pUVar3;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *pMVar4;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar5;
  matched_t<wasm::Const_*> pCVar6;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
  *pMVar7;
  matched_t<wasm::Const_*> *ppCVar8;
  bool bVar9;
  BinaryOp BVar10;
  UnaryOp UVar11;
  Literal local_48;
  
  if (candidate->_id == BinaryId) {
    if (this->binder !=
        (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> *
        )0x0) {
      *this->binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
            )candidate;
    }
    BVar1 = *(BinaryOp *)(candidate + 1);
    BVar10 = Abstract::getBinary((Type)*(uintptr_t *)(candidate[1].type.id + 8),this->data);
    if ((BVar1 == BVar10) &&
       (pUVar3 = (matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>
                  )candidate[1].type.id,
       (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId)
       ) {
      pMVar4 = (this->submatchers).curr;
      if (pMVar4->binder !=
          (matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_> *
          )0x0) {
        *pMVar4->binder = pUVar3;
      }
      UVar2 = pUVar3->op;
      UVar11 = AbstractUnaryOpK::getOp((Type)(pUVar3->value->type).id,pMVar4->data);
      if (UVar2 == UVar11) {
        ppEVar5 = ((pMVar4->submatchers).curr)->binder;
        if (ppEVar5 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
          *ppEVar5 = pUVar3->value;
        }
        pCVar6 = *(matched_t<wasm::Const_*> *)(candidate + 2);
        if ((pCVar6->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
            ConstId) {
          pMVar7 = (this->submatchers).next.curr;
          ppCVar8 = pMVar7->binder;
          if (ppCVar8 != (matched_t<wasm::Const_*> *)0x0) {
            *ppCVar8 = pCVar6;
          }
          Literal::Literal(&local_48,&pCVar6->value);
          bVar9 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>
                  ::matches(&(pMVar7->submatchers).curr,&local_48);
          Literal::~Literal(&local_48);
          return bVar9;
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }